

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O0

int32 free_mllr_A(float32 ****A,uint32 n_class,uint32 n_stream)

{
  uint local_20;
  uint local_1c;
  uint32 j;
  uint32 i;
  uint32 n_stream_local;
  uint32 n_class_local;
  float32 ****A_local;
  
  for (local_1c = 0; local_1c < n_class; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < n_stream; local_20 = local_20 + 1) {
      ckd_free_2d(A[local_1c][local_20]);
    }
  }
  ckd_free_2d(A);
  return 0;
}

Assistant:

int32
free_mllr_A(float32 ****A,
	    uint32  n_class,
	    uint32  n_stream)
{
    uint32 i,j;

    for (i=0; i < n_class; i++) {
	for (j=0; j < n_stream; j++) {
	    ckd_free_2d((void **)A[i][j]);
	}
    }
    ckd_free_2d((void **)A);

    return S3_SUCCESS;
}